

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_DefaultConstructor_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
::TestBody(ParticleArrayTest_DefaultConstructor_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  bool bVar1;
  int iVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  ParticleArray particles;
  type *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  int *expected;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *in_stack_ffffffffffffff20;
  Type in_stack_ffffffffffffff2c;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *in_stack_ffffffffffffff30;
  AssertionResult local_c0;
  int local_b0 [2];
  Message *in_stack_ffffffffffffff58;
  AssertHelper *in_stack_ffffffffffffff60;
  
  expected = local_b0;
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::ParticleArraySoA
            (in_stack_ffffffffffffff30);
  iVar2 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::size
                    ((ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *)0x208c80);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (char *)CONCAT44(in_stack_ffffffffffffff14,iVar2),expected,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x208cf5)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               (char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
               (char *)CONCAT44(in_stack_ffffffffffffff14,iVar2));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x208d43);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x208da3);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::~ParticleArraySoA
            (in_stack_ffffffffffffff20);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, DefaultConstructor)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    ASSERT_EQ(0, particles.size());
}